

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeParser.hpp
# Opt level: O0

void __thiscall antlr::TreeParser::matchNot(TreeParser *this,RefAST *t,int ttype)

{
  int iVar1;
  AST *pAVar2;
  AST *pAVar3;
  ASTRefCount<antlr::AST> *other;
  ASTRefCount<antlr::AST> *this_00;
  int in_EDX;
  ASTRefCount *in_RSI;
  long *in_RDI;
  bool in_stack_00000033;
  int in_stack_00000034;
  RefAST *in_stack_00000038;
  int in_stack_00000044;
  char **in_stack_00000048;
  MismatchedTokenException *in_stack_00000050;
  
  pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RSI);
  if (pAVar2 != (AST *)0x0) {
    pAVar2 = ASTRefCount::operator_cast_to_AST_(in_RSI);
    pAVar3 = ASTRefCount::operator_cast_to_AST_((ASTRefCount *)&ASTNULL);
    if (pAVar2 != pAVar3) {
      pAVar2 = ASTRefCount<antlr::AST>::operator->((ASTRefCount<antlr::AST> *)in_RSI);
      iVar1 = (*pAVar2->_vptr_AST[0x10])();
      if (iVar1 != in_EDX) {
        return;
      }
    }
  }
  other = (ASTRefCount<antlr::AST> *)__cxa_allocate_exception(200);
  this_00 = (ASTRefCount<antlr::AST> *)(**(code **)(*in_RDI + 0x40))();
  (**(code **)(*in_RDI + 0x38))();
  ASTRefCount<antlr::AST>::ASTRefCount(this_00,other);
  MismatchedTokenException::MismatchedTokenException
            (in_stack_00000050,in_stack_00000048,in_stack_00000044,in_stack_00000038,
             in_stack_00000034,in_stack_00000033);
  __cxa_throw(other,&MismatchedTokenException::typeinfo,
              MismatchedTokenException::~MismatchedTokenException);
}

Assistant:

virtual void matchNot(RefAST t, int ttype)
	{
		if ( !t || t == ASTNULL || t->getType() == ttype )
			throw MismatchedTokenException( getTokenNames(), getNumTokens(),
													  t, ttype, true );
	}